

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

void ERR_restore_state(ERR_SAVE_STATE *state)

{
  uint uVar1;
  ERR_STATE *pEVar2;
  ulong uVar3;
  long lVar4;
  
  if ((state != (ERR_SAVE_STATE *)0x0) && (state->num_errors != 0)) {
    if (state->num_errors < 0x10) {
      pEVar2 = err_get_state();
      if (pEVar2 != (ERR_STATE *)0x0) {
        if (state->num_errors == 0) {
          uVar1 = 0xffffffff;
        }
        else {
          lVar4 = 0;
          uVar3 = 0;
          do {
            err_copy((err_error_st *)((long)&pEVar2->errors[0].file + lVar4),
                     (err_error_st *)((long)&state->errors->file + lVar4));
            uVar3 = uVar3 + 1;
            lVar4 = lVar4 + 0x18;
          } while (uVar3 < state->num_errors);
          uVar1 = (int)state->num_errors - 1;
        }
        pEVar2->top = uVar1;
        pEVar2->bottom = 0xf;
      }
      return;
    }
    abort();
  }
  ERR_clear_error();
  return;
}

Assistant:

void ERR_restore_state(const ERR_SAVE_STATE *state) {
  if (state == NULL || state->num_errors == 0) {
    ERR_clear_error();
    return;
  }

  if (state->num_errors >= ERR_NUM_ERRORS) {
    abort();
  }

  ERR_STATE *const dst = err_get_state();
  if (dst == NULL) {
    return;
  }

  for (size_t i = 0; i < state->num_errors; i++) {
    err_copy(&dst->errors[i], &state->errors[i]);
  }
  dst->top = (unsigned)(state->num_errors - 1);
  dst->bottom = ERR_NUM_ERRORS - 1;
}